

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O3

Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
renderdesc::Pipeline::load_abi_cxx11_
          (Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Pipeline *this,string_view s)

{
  pointer *ppTVar1;
  pointer pTVar2;
  Pipeline pipeline;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  ExpectedRef<const_Mapping,_std::string> root_mapping_result;
  Loader loader;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  root;
  undefined1 local_238 [16];
  undefined1 local_228 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  pointer pPStack_1f0;
  pointer local_1e8;
  pointer pPStack_1e0;
  vector<renderdesc::Command,_std::allocator<renderdesc::Command>_> local_1d8;
  undefined1 local_1b8 [32];
  bool local_198;
  undefined1 local_190 [32];
  char local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  pointer local_148;
  undefined1 local_138 [16];
  Loader local_128;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  
  yaml::parse_abi_cxx11_(&local_88,(yaml *)this,s);
  if (local_88.has_value_ == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                   "Cannot load pipeline: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88);
    if ((pointer)local_238._0_8_ == (pointer)(local_238 + 0x10)) {
      local_128.names_.framebuffer.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
      pTVar2 = (pointer)&local_128.names_;
    }
    else {
      local_128.pipeline_ = (Pipeline *)local_238._0_8_;
      pTVar2 = (pointer)local_238._0_8_;
    }
    ppTVar1 = &(__return_storage_ptr__->field_0).value_.textures.
               super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->field_0).value_.textures.
    super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppTVar1;
    if ((anon_struct_96_4_06235674_for_names_ *)pTVar2 == &local_128.names_) {
      *ppTVar1 = (pointer)local_228._0_8_;
      (__return_storage_ptr__->field_0).value_.framebuffers.
      super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_128.names_.framebuffer.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (__return_storage_ptr__->field_0).value_.textures.
      super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
      super__Vector_impl_data._M_start = pTVar2;
      (__return_storage_ptr__->field_0).value_.textures.
      super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_228._0_8_;
    }
    (__return_storage_ptr__->field_0).value_.textures.
    super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
    __return_storage_ptr__->has_value_ = false;
  }
  else {
    yaml::Value::getMapping_abi_cxx11_
              ((ExpectedRef<const_Mapping,_std::string> *)
               &((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                  *)local_190)->value_,(Value *)&local_88);
    if (local_170 == '\0') {
      local_238._0_8_ = (pointer)(local_238 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_238,"Root pipeline desc object is not a mapping","");
      if ((pointer)local_238._0_8_ == (pointer)(local_238 + 0x10)) {
        local_128.names_.framebuffer.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
        pTVar2 = (pointer)&local_128.names_;
      }
      else {
        local_128.pipeline_ = (Pipeline *)local_238._0_8_;
        pTVar2 = (pointer)local_238._0_8_;
      }
      ppTVar1 = &(__return_storage_ptr__->field_0).value_.textures.
                 super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->field_0).value_.textures.
      super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppTVar1;
      if ((anon_struct_96_4_06235674_for_names_ *)pTVar2 == &local_128.names_) {
        *ppTVar1 = (pointer)local_228._0_8_;
        (__return_storage_ptr__->field_0).value_.framebuffers.
        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)local_128.names_.framebuffer.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (__return_storage_ptr__->field_0).value_.textures.
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_start = pTVar2;
        (__return_storage_ptr__->field_0).value_.textures.
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_228._0_8_;
      }
      (__return_storage_ptr__->field_0).value_.textures.
      super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
      __return_storage_ptr__->has_value_ = false;
    }
    else {
      local_1d8.super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1e8 = (pointer)0x0;
      pPStack_1e0 = (pointer)0x0;
      local_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pPStack_1f0 = (pointer)0x0;
      local_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228._16_8_ = (pointer)0x0;
      local_228._24_8_ = (pointer)0x0;
      local_228._0_8_ = (pointer)0x0;
      local_228._8_8_ = (pointer)0x0;
      local_238._0_8_ = (pointer)0x0;
      local_238._8_8_ = (pointer)0x0;
      local_1d8.super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_128.root_ = (Mapping *)local_190._0_8_;
      local_128.pipeline_ = (Pipeline *)local_238;
      memset(&local_128.names_,0,0x90);
      Loader::load_abi_cxx11_
                ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1b8,&local_128);
      if (local_198 == false) {
        std::operator+(&local_168,"Cannot load pipeline: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p == &local_168.field_2) {
          local_138._8_8_ = local_168.field_2._8_8_;
          local_168._M_dataplus._M_p = (pointer)local_138;
        }
        else {
          local_148 = (pointer)local_168._M_dataplus._M_p;
        }
        ppTVar1 = &(__return_storage_ptr__->field_0).value_.textures.
                   super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        (__return_storage_ptr__->field_0).value_.textures.
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppTVar1;
        if ((pointer)local_168._M_dataplus._M_p == (pointer)local_138) {
          *ppTVar1 = (pointer)local_168.field_2._M_allocated_capacity;
          (__return_storage_ptr__->field_0).value_.framebuffers.
          super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_138._8_8_;
        }
        else {
          (__return_storage_ptr__->field_0).value_.textures.
          super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_168._M_dataplus._M_p;
          (__return_storage_ptr__->field_0).value_.textures.
          super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_168.field_2._M_allocated_capacity;
        }
        (__return_storage_ptr__->field_0).value_.textures.
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_168._M_string_length;
        __return_storage_ptr__->has_value_ = false;
      }
      else {
        (__return_storage_ptr__->field_0).value_.textures.
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
        (__return_storage_ptr__->field_0).value_.textures.
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
        (__return_storage_ptr__->field_0).value_.textures.
        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_228._0_8_;
        local_228._0_8_ = (pointer)0x0;
        local_238._0_8_ = (pointer)0x0;
        local_238._8_8_ = (pointer)0x0;
        (__return_storage_ptr__->field_0).value_.framebuffers.
        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_228._8_8_;
        (__return_storage_ptr__->field_0).value_.framebuffers.
        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._16_8_;
        (__return_storage_ptr__->field_0).value_.framebuffers.
        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_228._24_8_;
        local_228._24_8_ = (pointer)0x0;
        local_228._8_8_ = (pointer)0x0;
        local_228._16_8_ = (pointer)0x0;
        (__return_storage_ptr__->field_0).value_.shader_filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_208.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->field_0).value_.shader_filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_208.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->field_0).value_.shader_filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_208.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_208.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_208.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_208.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->field_0).value_.programs.
        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
        super__Vector_impl_data._M_start = pPStack_1f0;
        (__return_storage_ptr__->field_0).value_.programs.
        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
        super__Vector_impl_data._M_finish = local_1e8;
        (__return_storage_ptr__->field_0).value_.programs.
        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pPStack_1e0;
        pPStack_1e0 = (pointer)0x0;
        pPStack_1f0 = (pointer)0x0;
        local_1e8 = (pointer)0x0;
        (__return_storage_ptr__->field_0).value_.commands.
        super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1d8.super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->field_0).value_.commands.
        super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1d8.super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->field_0).value_.commands.
        super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1d8.super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1d8.super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1d8.super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1d8.super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __return_storage_ptr__->has_value_ = true;
      }
      if (((local_198 & 1U) == 0) && ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      if (local_128.indexes_.texture.
          super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.indexes_.texture.
                        super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.indexes_.texture.
                              super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.indexes_.texture.
                              super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_128.indexes_.framebuffer.
          super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.indexes_.framebuffer.
                        super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.indexes_.framebuffer.
                              super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.indexes_.framebuffer.
                              super__Vector_base<renderdesc::Command::Index,_std::allocator<renderdesc::Command::Index>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128.names_.shader);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128.names_.program);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128.names_.texture);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_128.names_.framebuffer);
      std::vector<renderdesc::Command,_std::allocator<renderdesc::Command>_>::~vector(&local_1d8);
      if (pPStack_1f0 != (pointer)0x0) {
        operator_delete(pPStack_1f0,(long)pPStack_1e0 - (long)pPStack_1f0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_208);
      if ((pointer)local_228._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_228._8_8_,local_228._24_8_ - local_228._8_8_);
      }
      std::vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>::~vector
                ((vector<renderdesc::Texture,_std::allocator<renderdesc::Texture>_> *)local_238);
    }
    if ((local_170 == '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&(((anon_union_32_2_9b3c4038_for_Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
                      *)local_190)->error_).error_ + 0x10U))) {
      operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
    }
  }
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected(&local_88);
  return __return_storage_ptr__;
}

Assistant:

Expected<Pipeline, std::string> Pipeline::load(std::string_view s) {
	const auto root = yaml::parse(s);
	if (!root)
		return Unexpected("Cannot load pipeline: " + root.error());

	auto root_mapping_result = root.value().getMapping();
	if (!root_mapping_result)
		return Unexpected<std::string>("Root pipeline desc object is not a mapping");

	Pipeline pipeline;
	Loader loader(pipeline, root_mapping_result.value());
	const auto result = loader.load();
	if (!result)
		return Unexpected("Cannot load pipeline: " + result.error());

	return pipeline;
}